

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChargeAtomTypesSectionParser.cpp
# Opt level: O2

void __thiscall
OpenMD::ChargeAtomTypesSectionParser::parseLine
          (ChargeAtomTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  int iVar1;
  AtomType *pAVar2;
  RealType RVar3;
  FixedChargeAdapter fca;
  string atomTypeName;
  StringTokenizer tokenizer;
  FixedChargeAdapter local_a8;
  double local_a0;
  string local_98;
  StringTokenizer local_78;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98," ;\t\n\r",(allocator<char> *)&local_a8);
  StringTokenizer::StringTokenizer(&local_78,line,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  iVar1 = StringTokenizer::countTokens(&local_78);
  if (iVar1 < 2) {
    snprintf(painCave.errMsg,2000,
             "ChargeAtomTypesSectionParser Error: Not enough tokens at line %d\n",
             (ulong)(uint)lineNo);
    painCave.isFatal = 1;
    simError();
  }
  else {
    local_a0 = (this->options_->ChargeUnitScaling).data_;
    StringTokenizer::nextToken_abi_cxx11_(&local_98,&local_78);
    pAVar2 = ForceField::getAtomType(ff,&local_98);
    if (pAVar2 == (AtomType *)0x0) {
      snprintf(painCave.errMsg,2000,
               "ChargeAtomTypesSectionParser Error: Can not find matching AtomType at line %d\n",
               (ulong)(uint)lineNo);
      painCave.isFatal = 1;
      simError();
    }
    else {
      local_a8.at_ = pAVar2;
      RVar3 = StringTokenizer::nextTokenAsDouble(&local_78);
      FixedChargeAdapter::makeFixedCharge(&local_a8,local_a0 * RVar3);
    }
    std::__cxx11::string::~string((string *)&local_98);
  }
  StringTokenizer::~StringTokenizer(&local_78);
  return;
}

Assistant:

void ChargeAtomTypesSectionParser::parseLine(ForceField& ff,
                                               const std::string& line,
                                               int lineNo) {
    StringTokenizer tokenizer(line);
    int nTokens = tokenizer.countTokens();

    if (nTokens < 2) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "ChargeAtomTypesSectionParser Error: Not enough tokens at line %d\n",
          lineNo);
      painCave.isFatal = 1;
      simError();
    } else {
      RealType cus_ = options_.getChargeUnitScaling();

      std::string atomTypeName = tokenizer.nextToken();

      AtomType* atomType = ff.getAtomType(atomTypeName);
      if (atomType != NULL) {
        FixedChargeAdapter fca = FixedChargeAdapter(atomType);
        RealType charge        = cus_ * tokenizer.nextTokenAsDouble();
        fca.makeFixedCharge(charge);
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "ChargeAtomTypesSectionParser Error: Can not find matching "
                 "AtomType at "
                 "line %d\n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      }
    }
  }